

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

void ngx_http_upstream_finalize_request(ngx_http_request_t *r,ngx_http_upstream_t *u,ngx_int_t rc)

{
  ngx_log_t *log;
  int iVar1;
  int *piVar2;
  time_t tVar3;
  time_t valid;
  ngx_uint_t flush;
  ngx_int_t rc_local;
  ngx_http_upstream_t *u_local;
  ngx_http_request_t *r_local;
  
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"finalize http upstream request: %i",rc);
  }
  if (u->cleanup == (ngx_http_cleanup_pt *)0x0) {
    ngx_http_finalize_request(r,-4);
  }
  else {
    *u->cleanup = (ngx_http_cleanup_pt)0x0;
    u->cleanup = (ngx_http_cleanup_pt *)0x0;
    if ((u->resolved != (ngx_http_upstream_resolved_t *)0x0) &&
       (u->resolved->ctx != (ngx_resolver_ctx_t *)0x0)) {
      ngx_resolve_name_done(u->resolved->ctx);
      u->resolved->ctx = (ngx_resolver_ctx_t *)0x0;
    }
    if ((((u->state != (ngx_http_upstream_state_t *)0x0) && (u->state->response_time != 0)) &&
        (u->state->response_time = ngx_current_msec - u->state->response_time,
        u->pipe != (ngx_event_pipe_t *)0x0)) && (u->pipe->read_length != 0)) {
      u->state->bytes_received =
           (u->pipe->read_length - u->pipe->preread_size) + u->state->bytes_received;
      u->state->response_length = u->pipe->read_length;
    }
    (*u->finalize_request)(r,rc);
    if (((u->peer).free != (ngx_event_free_peer_pt)0x0) && ((u->peer).sockaddr != (sockaddr *)0x0))
    {
      (*(u->peer).free)(&u->peer,(u->peer).data,0);
      (u->peer).sockaddr = (sockaddr *)0x0;
    }
    if ((u->peer).connection != (ngx_connection_t *)0x0) {
      if ((r->connection->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,r->connection->log,0,"close http upstream connection: %d",
                           (ulong)(uint)((u->peer).connection)->fd);
      }
      if (((u->peer).connection)->pool != (ngx_pool_t *)0x0) {
        ngx_destroy_pool(((u->peer).connection)->pool);
      }
      ngx_close_connection((u->peer).connection);
    }
    (u->peer).connection = (ngx_connection_t *)0x0;
    if (((u->pipe != (ngx_event_pipe_t *)0x0) && (u->pipe->temp_file != (ngx_temp_file_t *)0x0)) &&
       ((r->connection->log->log_level & 0x100) != 0)) {
      ngx_log_error_core(8,r->connection->log,0,"http upstream temp fd: %d",
                         (ulong)(uint)(u->pipe->temp_file->file).fd);
    }
    if ((((((*(ushort *)&u->field_0x3e8 & 1) != 0) && (u->pipe != (ngx_event_pipe_t *)0x0)) &&
         (u->pipe->temp_file != (ngx_temp_file_t *)0x0)) &&
        (((u->pipe->temp_file->file).fd != -1 &&
         (iVar1 = unlink((char *)(u->pipe->temp_file->file).name.data), iVar1 == -1)))) &&
       (2 < r->connection->log->log_level)) {
      log = r->connection->log;
      piVar2 = __errno_location();
      ngx_log_error_core(3,log,*piVar2,"unlink() \"%s\" failed",(u->pipe->temp_file->file).name.data
                        );
    }
    if (r->cache != (ngx_http_cache_t *)0x0) {
      if ((((*(ushort *)&u->field_0x3e8 >> 1 & 1) != 0) && ((rc == 0x1f6 || (rc == 0x1f8)))) &&
         (tVar3 = ngx_http_file_cache_valid(u->conf->cache_valid,rc), tVar3 != 0)) {
        r->cache->valid_sec = ngx_cached_time->sec + tVar3;
        r->cache->error = rc;
      }
      ngx_http_file_cache_free(r->cache,u->pipe->temp_file);
    }
    if (((*(ulong *)&r->field_0x460 >> 0x3b & 1) != 0) && (299 < (u->headers_in).status_n)) {
      (u->buffer).last = (u->buffer).pos;
    }
    r->read_event_handler = ngx_http_block_reading;
    if (rc != -5) {
      r->connection->log->action = "sending to client";
      if (((((*(ushort *)&u->field_0x3e8 >> 0xc & 1) == 0) || (rc == 0x198)) || (rc == 499)) ||
         ((u->pipe != (ngx_event_pipe_t *)0x0 && ((*(ushort *)&u->pipe->field_0x68 >> 9 & 1) != 0)))
         ) {
        ngx_http_finalize_request(r,rc);
      }
      else {
        flush = rc;
        if (299 < rc) {
          flush = 0xffffffffffffffff;
        }
        if ((*(ulong *)&r->field_0x468 >> 9 & 1) == 0) {
          if (flush == 0) {
            flush = ngx_http_send_special(r,1);
          }
          else if (299 < rc) {
            *(ulong *)&r->field_0x468 = *(ulong *)&r->field_0x468 & 0xfffffffffffffbff;
            flush = ngx_http_send_special(r,2);
          }
          ngx_http_finalize_request(r,flush);
        }
        else {
          ngx_http_finalize_request(r,flush);
        }
      }
    }
  }
  return;
}

Assistant:

static void
ngx_http_upstream_finalize_request(ngx_http_request_t *r,
    ngx_http_upstream_t *u, ngx_int_t rc)
{
    ngx_uint_t  flush;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "finalize http upstream request: %i", rc);

    if (u->cleanup == NULL) {
        /* the request was already finalized */
        ngx_http_finalize_request(r, NGX_DONE);
        return;
    }

    *u->cleanup = NULL;
    u->cleanup = NULL;

    if (u->resolved && u->resolved->ctx) {
        ngx_resolve_name_done(u->resolved->ctx);
        u->resolved->ctx = NULL;
    }

    if (u->state && u->state->response_time) {
        u->state->response_time = ngx_current_msec - u->state->response_time;

        if (u->pipe && u->pipe->read_length) {
            u->state->bytes_received += u->pipe->read_length
                                        - u->pipe->preread_size;
            u->state->response_length = u->pipe->read_length;
        }
    }

    u->finalize_request(r, rc);

    if (u->peer.free && u->peer.sockaddr) {
        u->peer.free(&u->peer, u->peer.data, 0);
        u->peer.sockaddr = NULL;
    }

    if (u->peer.connection) {

#if (NGX_HTTP_SSL)

        /* TODO: do not shutdown persistent connection */

        if (u->peer.connection->ssl) {

            /*
             * We send the "close notify" shutdown alert to the upstream only
             * and do not wait its "close notify" shutdown alert.
             * It is acceptable according to the TLS standard.
             */

            u->peer.connection->ssl->no_wait_shutdown = 1;

            (void) ngx_ssl_shutdown(u->peer.connection);
        }
#endif

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "close http upstream connection: %d",
                       u->peer.connection->fd);

        if (u->peer.connection->pool) {
            ngx_destroy_pool(u->peer.connection->pool);
        }

        ngx_close_connection(u->peer.connection);
    }

    u->peer.connection = NULL;

    if (u->pipe && u->pipe->temp_file) {
        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http upstream temp fd: %d",
                       u->pipe->temp_file->file.fd);
    }

    if (u->store && u->pipe && u->pipe->temp_file
        && u->pipe->temp_file->file.fd != NGX_INVALID_FILE)
    {
        if (ngx_delete_file(u->pipe->temp_file->file.name.data)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_CRIT, r->connection->log, ngx_errno,
                          ngx_delete_file_n " \"%s\" failed",
                          u->pipe->temp_file->file.name.data);
        }
    }

#if (NGX_HTTP_CACHE)

    if (r->cache) {

        if (u->cacheable) {

            if (rc == NGX_HTTP_BAD_GATEWAY || rc == NGX_HTTP_GATEWAY_TIME_OUT) {
                time_t  valid;

                valid = ngx_http_file_cache_valid(u->conf->cache_valid, rc);

                if (valid) {
                    r->cache->valid_sec = ngx_time() + valid;
                    r->cache->error = rc;
                }
            }
        }

        ngx_http_file_cache_free(r->cache, u->pipe->temp_file);
    }

#endif

    if (r->subrequest_in_memory
        && u->headers_in.status_n >= NGX_HTTP_SPECIAL_RESPONSE)
    {
        u->buffer.last = u->buffer.pos;
    }

    r->read_event_handler = ngx_http_block_reading;

    if (rc == NGX_DECLINED) {
        return;
    }

    r->connection->log->action = "sending to client";

    if (!u->header_sent
        || rc == NGX_HTTP_REQUEST_TIME_OUT
        || rc == NGX_HTTP_CLIENT_CLOSED_REQUEST
        || (u->pipe && u->pipe->downstream_error))
    {
        ngx_http_finalize_request(r, rc);
        return;
    }

    flush = 0;

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        rc = NGX_ERROR;
        flush = 1;
    }

    if (r->header_only) {
        ngx_http_finalize_request(r, rc);
        return;
    }

    if (rc == 0) {
        rc = ngx_http_send_special(r, NGX_HTTP_LAST);

    } else if (flush) {
        r->keepalive = 0;
        rc = ngx_http_send_special(r, NGX_HTTP_FLUSH);
    }

    ngx_http_finalize_request(r, rc);
}